

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

bool __thiscall
dg::llvmdg::legacy::GraphBuilder::createPthreadCreate
          (GraphBuilder *this,CallInst *callInst,Block *lastBlock)

{
  Function *llvmFunction;
  pointer ppFVar1;
  pointer ppFVar2;
  Function *function;
  iterator __begin2;
  pointer ppFVar3;
  iterator __end2;
  Function *forkFunction;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctionsWithBlock;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctions;
  Function *local_70;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_68;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_48;
  
  getCalledFunctions((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                     &local_48,this,
                     *(Value **)(callInst + (0x40 - (ulong)(uint)(*(int *)(callInst + 0x14) << 5))))
  ;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; ppFVar2 = local_68._M_impl.super__Vector_impl_data._M_finish,
      ppFVar1 = local_68._M_impl.super__Vector_impl_data._M_start,
      ppFVar3 = local_68._M_impl.super__Vector_impl_data._M_start,
      local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_start =
           local_48._M_impl.super__Vector_impl_data._M_start + 1) {
    local_70 = *local_48._M_impl.super__Vector_impl_data._M_start;
    if (*(Function **)(local_70 + 0x48) != local_70 + 0x48) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                 &local_68,&local_70);
    }
  }
  for (; ppFVar3 != ppFVar2; ppFVar3 = ppFVar3 + 1) {
    llvmFunction = *ppFVar3;
    function = createOrGetFunction(this,llvmFunction);
    Block::addFork(lastBlock,llvmFunction,function);
  }
  std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~_Vector_base
            (&local_68);
  std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~_Vector_base
            (&local_48);
  return ppFVar2 != ppFVar1;
}

Assistant:

bool GraphBuilder::createPthreadCreate(const llvm::CallInst *callInst,
                                       Block *lastBlock) {
    bool createBlock = false;
    llvm::Value *calledValue = callInst->getArgOperand(2);
    auto forkFunctions = getCalledFunctions(calledValue);
    std::vector<const llvm::Function *> forkFunctionsWithBlock;
    for (const auto *forkFunction : forkFunctions) {
        if (!forkFunction->empty()) {
            forkFunctionsWithBlock.push_back(forkFunction);
        }
    }
    createBlock |= forkFunctionsWithBlock.size();
    for (const auto *forkFunction : forkFunctionsWithBlock) {
        auto *function = createOrGetFunction(forkFunction);
        lastBlock->addFork(forkFunction, function);
    }
    return createBlock;
}